

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseAction(WastParser *this,ActionPtr *out_action)

{
  Action *pAVar1;
  undefined8 uVar2;
  Result RVar3;
  TokenType TVar4;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Token local_1e8;
  Token local_198;
  Var local_148;
  Var local_100;
  undefined1 auStack_b8 [8];
  Location loc;
  undefined1 local_80 [32];
  undefined1 *local_60 [2];
  undefined1 local_50 [39];
  allocator_type local_29;
  
  RVar3 = Expect(this,Lpar);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)local_80,this);
  loc.filename.size_ = local_80._16_8_;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_80._24_8_;
  auStack_b8 = (undefined1  [8])local_80._0_8_;
  loc.filename.data_ = (char *)local_80._8_8_;
  Token::~Token((Token *)local_80);
  TVar4 = Peek(this,0);
  if (TVar4 == Get) {
    Consume(&local_198,this);
    Token::~Token(&local_198);
    MakeUnique<wabt::GetAction,wabt::Location&>((wabt *)local_80,(Location *)auStack_b8);
    uVar2 = local_80._0_8_;
    Var::Var(&local_100,this->last_module_index_,(Location *)auStack_b8);
    ParseVarOpt(this,(Var *)(uVar2 + 0x28),&local_100);
    Var::~Var(&local_100);
    RVar3 = ParseQuotedText(this,(string *)(local_80._0_8_ + 0x70));
    uVar2 = local_80._0_8_;
    if (RVar3.enum_ != Error) {
      local_80._0_8_ = (Action *)0x0;
      pAVar1 = (out_action->_M_t).
               super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
               super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl;
      (out_action->_M_t).super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
      super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl = (Action *)uVar2;
      if (pAVar1 == (Action *)0x0) goto LAB_00f60b12;
      (*pAVar1->_vptr_Action[1])();
    }
    if ((Action *)local_80._0_8_ != (Action *)0x0) {
      (**(code **)(*(long *)local_80._0_8_ + 8))();
    }
    if (RVar3.enum_ == Error) {
      return (Result)Error;
    }
  }
  else {
    if (TVar4 != Invoke) {
      local_80._0_8_ = local_80 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"invoke","");
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"get","");
      __l._M_len = 2;
      __l._M_array = (iterator)local_80;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&loc.field_1 + 8),__l,&local_29);
      RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)((long)&loc.field_1 + 8),(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&loc.field_1 + 8));
      lVar5 = 0;
      do {
        if (local_50 + lVar5 != *(undefined1 **)((long)local_60 + lVar5)) {
          operator_delete(*(undefined1 **)((long)local_60 + lVar5));
        }
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != -0x40);
      return (Result)RVar3.enum_;
    }
    Consume(&local_1e8,this);
    Token::~Token(&local_1e8);
    MakeUnique<wabt::InvokeAction,wabt::Location&>((wabt *)local_80,(Location *)auStack_b8);
    uVar2 = local_80._0_8_;
    Var::Var(&local_148,this->last_module_index_,(Location *)auStack_b8);
    ParseVarOpt(this,(Var *)(uVar2 + 0x28),&local_148);
    Var::~Var(&local_148);
    RVar3 = ParseQuotedText(this,(string *)(local_80._0_8_ + 0x70));
    if ((RVar3.enum_ == Error) ||
       (RVar3 = ParseConstList(this,(ConstVector *)(local_80._0_8_ + 0x98)), uVar2 = local_80._0_8_,
       RVar3.enum_ == Error)) {
      if ((Action *)local_80._0_8_ != (Action *)0x0) {
        (**(code **)(*(long *)local_80._0_8_ + 8))();
      }
      return (Result)Error;
    }
    local_80._0_8_ = (Action *)0x0;
    pAVar1 = (out_action->_M_t).
             super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
             super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
             super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl;
    (out_action->_M_t).super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
    super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl = (Action *)uVar2;
    if ((pAVar1 != (Action *)0x0) &&
       ((*pAVar1->_vptr_Action[1])(), (Action *)local_80._0_8_ != (Action *)0x0)) {
      (**(code **)(*(long *)local_80._0_8_ + 8))();
    }
  }
LAB_00f60b12:
  RVar3 = Expect(this,Rpar);
  return (Result)(uint)(RVar3.enum_ == Error);
}

Assistant:

Result WastParser::ParseAction(ActionPtr* out_action) {
  WABT_TRACE(ParseAction);
  EXPECT(Lpar);
  Location loc = GetLocation();

  switch (Peek()) {
    case TokenType::Invoke: {
      Consume();
      auto action = MakeUnique<InvokeAction>(loc);
      ParseVarOpt(&action->module_var, Var(last_module_index_, loc));
      CHECK_RESULT(ParseQuotedText(&action->name));
      CHECK_RESULT(ParseConstList(&action->args));
      *out_action = std::move(action);
      break;
    }

    case TokenType::Get: {
      Consume();
      auto action = MakeUnique<GetAction>(loc);
      ParseVarOpt(&action->module_var, Var(last_module_index_, loc));
      CHECK_RESULT(ParseQuotedText(&action->name));
      *out_action = std::move(action);
      break;
    }

    default:
      return ErrorExpected({"invoke", "get"});
  }
  EXPECT(Rpar);
  return Result::Ok;
}